

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_neg_not(ASMState *as,IRIns *ir,x86Group3 xg)

{
  Reg r2;
  int iVar1;
  int in_EDX;
  ASMState *in_RSI;
  ASMState *in_RDI;
  Reg dest;
  undefined4 in_stack_ffffffffffffffe8;
  
  r2 = ra_dest(in_RSI,(IRIns *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  iVar1 = 0;
  if ((0x604208U >> ((byte)in_RSI->cost[1] & 0x1f) & 1) != 0) {
    iVar1 = 0x80200;
  }
  emit_rr(in_RDI,XO_GROUP3,in_EDX + iVar1,r2);
  ra_left((ASMState *)CONCAT44(xg,dest),(Reg)((ulong)in_RDI >> 0x20),(IRRef)in_RDI);
  return;
}

Assistant:

static void asm_neg_not(ASMState *as, IRIns *ir, x86Group3 xg)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  emit_rr(as, XO_GROUP3, REX_64IR(ir, xg), dest);
  ra_left(as, dest, ir->op1);
}